

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O1

void amrex::ParmParse::Initialize(int argc,char **argv,char *parfile)

{
  ulong uVar1;
  string argstr;
  list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> arg_table;
  char *local_70;
  undefined8 local_68;
  char local_60;
  undefined7 uStack_5f;
  _List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> local_50;
  char *local_38;
  
  if ((anonymous_namespace)::(anonymous_namespace)::initialized == '\x01') {
    Error_host("ParmParse::Initialize(): already initialized!");
  }
  if (parfile != (char *)0x0) {
    anon_unknown_12::read_file
              (parfile,(list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
                        *)&(anonymous_namespace)::g_table_abi_cxx11_);
  }
  if (0 < argc) {
    local_68 = 0;
    local_60 = '\0';
    uVar1 = 0;
    local_70 = &local_60;
    do {
      std::__cxx11::string::append((char *)&local_70);
      std::__cxx11::string::push_back((char)&local_70);
      uVar1 = uVar1 + 1;
    } while ((uint)argc != uVar1);
    local_50._M_impl._M_node._M_size = 0;
    local_38 = local_70;
    local_50._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_50;
    local_50._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_50;
    anon_unknown_12::bldTable
              (&local_38,
               (list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
               &local_50);
    if (local_50._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_50) {
      std::__detail::_List_node_base::_M_transfer
                ((_List_node_base *)&(anonymous_namespace)::g_table_abi_cxx11_,
                 local_50._M_impl._M_node.super__List_node_base._M_next);
      _DAT_00842700 = _DAT_00842700 + local_50._M_impl._M_node._M_size;
      local_50._M_impl._M_node._M_size = 0;
    }
    std::__cxx11::
    _List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::_M_clear
              (&local_50);
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
  }
  (anonymous_namespace)::(anonymous_namespace)::initialized = 1;
  ExecOnFinalize((PTR_TO_VOID_FUNC)0x51d3a8);
  return;
}

Assistant:

void
ParmParse::Initialize (int         argc,
                       char**      argv,
                       const char* parfile)
{
    if ( initialized )
    {
        amrex::Error("ParmParse::Initialize(): already initialized!");
    }

    ppinit(argc, argv, parfile, g_table);

    amrex::ExecOnFinalize(ParmParse::Finalize);
}